

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  byte *pbVar4;
  undefined3 in_register_00000089;
  size_t len;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,tag_may_val);
  iVar3 = mbedtls_asn1_get_tag(p,end,&len,0x30);
  if (iVar3 == 0) {
    local_3c = (undefined4)CONCAT71(in_register_00000011,tag_must_mask);
    local_38 = (undefined4)CONCAT71(in_register_00000009,tag_must_val);
    pbVar4 = *p;
    if (pbVar4 + len == end) {
      while (pbVar4 < end) {
        *p = pbVar4 + 1;
        bVar1 = *pbVar4;
        if ((bVar1 & (byte)local_3c) != (byte)local_38) {
          return -0x62;
        }
        iVar3 = mbedtls_asn1_get_len(p,end,&len);
        sVar2 = len;
        if (iVar3 != 0) {
          return iVar3;
        }
        if (((cb != (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0) &&
            ((bVar1 & tag_may_mask) == (byte)local_34)) &&
           (iVar3 = (*cb)(ctx,(int)bVar1,*p,len), iVar3 != 0)) {
          return iVar3;
        }
        pbVar4 = *p + sVar2;
        *p = pbVar4;
      }
      iVar3 = 0;
    }
    else {
      iVar3 = -0x66;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)( void *ctx, int tag,
               unsigned char *start, size_t len ),
    void *ctx )
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( ret );
    }

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        unsigned char const tag = *(*p)++;

        if( ( tag & tag_must_mask ) != tag_must_val )
            return( MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

        if( ( ret = mbedtls_asn1_get_len( p, end, &len ) ) != 0 )
            return( ret );

        if( ( tag & tag_may_mask ) == tag_may_val )
        {
            if( cb != NULL )
            {
                ret = cb( ctx, tag, *p, len );
                if( ret != 0 )
                    return( ret );
            }
        }

        *p += len;
    }

    return( 0 );
}